

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

BuiltinFunction *
math_function(BuiltinFunction *__return_storage_ptr__,string *name,_func_double_double *fun)

{
  anon_class_40_2_65dcc395 local_50;
  int local_28 [2];
  _func_double_double *local_20;
  _func_double_double *fun_local;
  string *name_local;
  
  local_28[1] = 1;
  local_28[0] = 1;
  local_20 = fun;
  fun_local = (_func_double_double *)name;
  name_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  local_50.fun = local_20;
  std::
  tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ::
  tuple<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kalinochkind[P]scheme_src_std_builtins_math_cpp:36:19),_true,_true>
            (__return_storage_ptr__,local_28 + 1,local_28,&local_50);
  math_function(std::__cxx11::string_const&,double(*)(double))::$_0::~__0((__0 *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

BuiltinFunction math_function(const std::string &name, double (*fun)(double))
{
    return {1, 1, [name, fun](const std::list<std::shared_ptr<SchemeObject>> &l) {
        double arg = get_value(l.front(), name + ": number required");
        return to_object(std::make_shared<SchemeFloat>(fun(arg)));
    }};
}